

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatUtils.h
# Opt level: O0

void xSAT_UtilSelectSort(void **pArray,int nSize,_func_int_void_ptr_void_ptr *CompFnct)

{
  void *pvVar1;
  int iVar2;
  void *pTmp;
  int local_28;
  int iBest;
  int j;
  int i;
  _func_int_void_ptr_void_ptr *CompFnct_local;
  int nSize_local;
  void **pArray_local;
  
  for (iBest = 0; iBest < nSize + -1; iBest = iBest + 1) {
    pTmp._4_4_ = iBest;
    local_28 = iBest;
    while (local_28 = local_28 + 1, local_28 < nSize) {
      iVar2 = (*CompFnct)(pArray[local_28],pArray[pTmp._4_4_]);
      if (iVar2 != 0) {
        pTmp._4_4_ = local_28;
      }
    }
    pvVar1 = pArray[iBest];
    pArray[iBest] = pArray[pTmp._4_4_];
    pArray[pTmp._4_4_] = pvVar1;
  }
  return;
}

Assistant:

ABC_NAMESPACE_HEADER_START

/**Function*************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline void xSAT_UtilSelectSort( void** pArray, int nSize, int(* CompFnct )( const void *, const void * ) )
{
    int i, j, iBest;
    void* pTmp;

    for ( i = 0; i < ( nSize - 1 ); i++ )
    {
        iBest = i;
        for ( j = i + 1; j < nSize; j++ )
        {
            if ( CompFnct( pArray[j], pArray[iBest] ) )
                iBest = j;
        }
        pTmp = pArray[i];
        pArray[i] = pArray[iBest];
        pArray[iBest] = pTmp;
    }
}